

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeaderStructs.cpp
# Opt level: O3

void readPic<PicHeaderSwitch>(istream *stream,PicHeader *header)

{
  pointer pPVar1;
  PicChunk *chunk;
  pointer pPVar2;
  PicChunkSwitch t_1;
  PicHeaderSwitch h;
  undefined1 local_50 [8];
  uint32_t local_48;
  undefined1 local_40 [12];
  undefined8 local_34;
  uint local_28;
  
  header->isSwitch = true;
  std::istream::read((char *)stream,(long)local_40);
  header->filesize = SUB84(local_40._4_8_,4);
  header->version = (int)local_40._4_8_;
  header->ew = (undefined2)local_34;
  header->eh = local_34._2_2_;
  header->width = local_34._4_2_;
  header->height = local_34._6_2_;
  std::vector<PicChunk,_std::allocator<PicChunk>_>::resize(&header->chunks,(ulong)local_28);
  std::istream::ignore((long)stream);
  pPVar2 = (header->chunks).super__Vector_base<PicChunk,_std::allocator<PicChunk>_>._M_impl.
           super__Vector_impl_data._M_start;
  pPVar1 = (header->chunks).super__Vector_base<PicChunk,_std::allocator<PicChunk>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pPVar2 != pPVar1) {
    do {
      std::istream::read((char *)stream,(long)local_50);
      pPVar2->x = local_50._0_2_;
      pPVar2->y = local_50._2_2_;
      pPVar2->offset = local_50._4_4_;
      pPVar2->size = local_48;
      pPVar2 = pPVar2 + 1;
    } while (pPVar2 != pPVar1);
  }
  return;
}

Assistant:

void readPic(std::istream& stream, PicHeader& header) {
	header.isSwitch = Header::IsSwitch::value;
	Header h = readRaw<Header>(stream);
	header.filesize = h.filesize.value();
	header.version = h.getVersion();
	header.eh = h.eh.value();
	header.ew = h.ew.value();
	header.width = h.width.value();
	header.height = h.height.value();
	header.chunks.resize(h.chunks.value());

	stream.ignore(h.bytesToSkip());

	for (auto& chunk : header.chunks) {
		auto c = readRaw<typename Header::Chunk>(stream);
		chunk.x = c.x.value();
		chunk.y = c.y.value();
		chunk.offset = c.offset.value();
		chunk.size = c.getSize();
	}
}